

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::module::module(module *this,char *name,char *doc)

{
  char cVar1;
  undefined8 *puVar2;
  PyObject *pPVar3;
  char *pcVar4;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  cVar1 = options::global_state()::instance;
  puVar2 = (undefined8 *)operator_new(0x68);
  pcVar4 = (char *)0x0;
  if (cVar1 != '\0') {
    pcVar4 = doc;
  }
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[5] = name;
  puVar2[6] = pcVar4;
  puVar2[7] = 0xffffffffffffffff;
  *puVar2 = 1;
  pPVar3 = (PyObject *)PyModule_Create2(puVar2,0x3f5);
  (this->super_object).super_handle.m_ptr = pPVar3;
  if (pPVar3 != (PyObject *)0x0) {
    pPVar3->ob_refcnt = pPVar3->ob_refcnt + 1;
    return;
  }
  pybind11_fail("Internal error in module::module()");
}

Assistant:

explicit module(const char *name, const char *doc = nullptr) {
        if (!options::show_user_defined_docstrings()) doc = nullptr;
#if PY_MAJOR_VERSION >= 3
        PyModuleDef *def = new PyModuleDef();
        std::memset(def, 0, sizeof(PyModuleDef));
        def->m_name = name;
        def->m_doc = doc;
        def->m_size = -1;
        Py_INCREF(def);
        m_ptr = PyModule_Create(def);
#else
        m_ptr = Py_InitModule3(name, nullptr, doc);
#endif
        if (m_ptr == nullptr)
            pybind11_fail("Internal error in module::module()");
        inc_ref();
    }